

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::AddForce(ChBody *this,shared_ptr<chrono::ChForce> *aforce)

{
  ChSystem *pCVar1;
  __normal_iterator<std::shared_ptr<chrono::ChForce>_*,_std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
  _Var2;
  
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChForce>*,std::vector<std::shared_ptr<chrono::ChForce>,std::allocator<std::shared_ptr<chrono::ChForce>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChForce>const>>
                    ((this->forcelist).
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->forcelist).
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,aforce);
  if (_Var2._M_current ==
      (this->forcelist).
      super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ((aforce->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body = this;
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(&this->forcelist,aforce);
    pCVar1 = (this->super_ChPhysicsItem).system;
    if (pCVar1 != (ChSystem *)0x0) {
      pCVar1->is_initialized = false;
      pCVar1->is_updated = false;
    }
    return;
  }
  __assert_fail("std::find<std::vector<std::shared_ptr<ChForce>>::iterator>(forcelist.begin(), forcelist.end(), aforce) == forcelist.end()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBody.cpp"
                ,0x1fb,"void chrono::ChBody::AddForce(std::shared_ptr<ChForce>)");
}

Assistant:

void ChBody::AddForce(std::shared_ptr<ChForce> aforce) {
    // don't allow double insertion of same object
    assert(std::find<std::vector<std::shared_ptr<ChForce>>::iterator>(forcelist.begin(), forcelist.end(), aforce) ==
           forcelist.end());

    aforce->SetBody(this);
    forcelist.push_back(aforce);

    // If the body is already added to a system, mark the system uninitialized and out-of-date
    if (system) {
        system->is_initialized = false;
        system->is_updated = false;
    }
}